

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampler.c
# Opt level: O0

float resampler_get_sample_float(void *_r)

{
  resampler *in_RDI;
  resampler *r;
  float local_4;
  
  if ((in_RDI->read_filled < 1) && ((in_RDI->phase_inc).quad != 0)) {
    resampler_fill_and_remove_delay(in_RDI);
  }
  if (in_RDI->read_filled < 1) {
    local_4 = 0.0;
  }
  else if ((in_RDI->quality == '\x01') || (in_RDI->quality == '\x03')) {
    local_4 = (float)((double)in_RDI->buffer_out[in_RDI->read_pos] + in_RDI->accumulator);
  }
  else {
    local_4 = in_RDI->buffer_out[in_RDI->read_pos];
  }
  return local_4;
}

Assistant:

float resampler_get_sample_float(void *_r)
{
    resampler * r = ( resampler * ) _r;
    if ( r->read_filled < 1 && r->phase_inc.quad)
        resampler_fill_and_remove_delay( r );
    if ( r->read_filled < 1 )
        return 0;
    if ( r->quality == RESAMPLER_QUALITY_BLEP || r->quality == RESAMPLER_QUALITY_BLAM )
        return (float)(r->buffer_out[ r->read_pos ] + r->accumulator);
    else
        return r->buffer_out[ r->read_pos ];
}